

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void interpolatetest(void)

{
  double dVar1;
  double local_98;
  double tablet [6];
  double tablei [6];
  double out;
  double val;
  double yhi;
  double ylo;
  int N;
  
  memset(tablet + 5,0,0x30);
  tablet[5] = -4.38;
  memset(&local_98,0,0x30);
  local_98 = 25.0;
  tablet[0] = 50.0;
  tablet[1] = 100.0;
  tablet[2] = 250.0;
  tablet[3] = 500.0;
  tablet[4] = 100000.0;
  ylo._4_4_ = 6;
  arrayminmax(tablet + 5,6,&yhi,&val);
  dVar1 = interpolate_linear(&local_98,tablet + 5,ylo._4_4_,2000.0);
  printf("OUT %g \n",dVar1);
  return;
}

Assistant:

void interpolatetest() {
	int N;
	double ylo,yhi,val,out;

	double tablei[6] = { -4.38, -4.15, -4.04, -3.99, -3.98, -3.96};
	double tablet[6] = {25, 50, 100, 250, 500, 100000};

	val = 2000;
	N = 6;

	arrayminmax(tablei,N,&ylo,&yhi);


	out = interpolate_linear(tablet,tablei,N,val);

	printf("OUT %g \n",out);


}